

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v8::detail::count_digits<4,fmt::v8::detail::fallback_uintptr>(fallback_uintptr n)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  fallback_uintptr n_local;
  
  iVar2 = 0x16;
  for (uVar3 = 7;
      (iVar1 = 8, bVar4 = n.value[0], iVar2 != 8 &&
      (bVar4 = n_local.value[uVar3], iVar1 = iVar2, bVar4 == 0)); uVar3 = uVar3 - 1) {
    iVar2 = iVar2 + -2;
  }
  uVar3 = 0x1f;
  if ((bVar4 | 1) != 0) {
    for (; (byte)((bVar4 | 1) >> uVar3) == 0; uVar3 = uVar3 - 1) {
    }
  }
  return iVar1 - ((uVar3 ^ 0x1c) >> 2);
}

Assistant:

FMT_FUNC int count_digits<4>(detail::fallback_uintptr n) {
  // fallback_uintptr is always stored in little endian.
  int i = static_cast<int>(sizeof(void*)) - 1;
  while (i > 0 && n.value[i] == 0) --i;
  auto char_digits = std::numeric_limits<unsigned char>::digits / 4;
  return i >= 0 ? i * char_digits + count_digits<4, unsigned>(n.value[i]) : 1;
}